

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

void __thiscall
VertexClustering::calcCurvature
          (VertexClustering *this,vector<VCFace_*,_std::allocator<VCFace_*>_> *faces)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  reference ppVVar4;
  Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> this_00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar5;
  Scalar *pSVar6;
  clock_t cVar7;
  vector<VCFace_*,_std::allocator<VCFace_*>_> *in_RSI;
  long in_RDI;
  double dVar8;
  undefined1 auVar9 [16];
  Matrix3d Stretch;
  Matrix3d Rotation;
  Vector3d D2;
  Vector3d D1;
  double weight;
  Vector2d eValues;
  Matrix2d eVecs;
  vector<double,_std::allocator<double>_> poly;
  Matrix3d w2o;
  Matrix3d o2w;
  int id;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  Vector3d origin;
  int i;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  pts;
  set<int,_std::less<int>,_std::allocator<int>_> rings;
  VCFace *f;
  iterator __end1;
  iterator __begin1;
  vector<VCFace_*,_std::allocator<VCFace_*>_> *__range1;
  int percent;
  int n10;
  int cnt;
  clock_t start;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffff8e8;
  Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> in_stack_fffffffffffff8f0;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffff8f8;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffff900;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffff908;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffff910;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffff918;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffff920;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffff928;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>_>
  *in_stack_fffffffffffff9c8;
  VCFace *in_stack_fffffffffffffa00;
  VertexClustering *in_stack_fffffffffffffa08;
  Matrix3d *in_stack_fffffffffffffa10;
  Scalar local_598;
  Scalar local_590 [5];
  undefined8 local_568;
  undefined8 local_560;
  undefined8 local_558;
  Scalar local_550;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffb30;
  VertexClustering *in_stack_fffffffffffffb38;
  Matrix2d *in_stack_fffffffffffffc68;
  Vector2d *in_stack_fffffffffffffc70;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc78;
  VertexClustering *in_stack_fffffffffffffc80;
  _Self local_d8;
  _Self local_d0;
  undefined1 *local_c8;
  int local_a8;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_90;
  undefined1 local_78 [48];
  VCFace *local_48;
  VCFace **local_40;
  __normal_iterator<VCFace_**,_std::vector<VCFace_*,_std::allocator<VCFace_*>_>_> local_38;
  vector<VCFace_*,_std::allocator<VCFace_*>_> *local_30;
  int local_24;
  int local_20;
  int local_1c;
  clock_t local_18;
  vector<VCFace_*,_std::allocator<VCFace_*>_> *local_10;
  
  local_10 = in_RSI;
  sVar3 = std::vector<VCFace_*,_std::allocator<VCFace_*>_>::size(in_RSI);
  printf("start to calculate curvature for %lu faces...\n",sVar3);
  local_18 = clock();
  local_1c = 0;
  sVar3 = std::vector<VCFace_*,_std::allocator<VCFace_*>_>::size(local_10);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar3;
  local_20 = SUB164(auVar1 / ZEXT816(10),0);
  local_24 = 1;
  local_30 = local_10;
  local_38._M_current =
       (VCFace **)
       std::vector<VCFace_*,_std::allocator<VCFace_*>_>::begin
                 ((vector<VCFace_*,_std::allocator<VCFace_*>_> *)in_stack_fffffffffffff8e8);
  local_40 = (VCFace **)
             std::vector<VCFace_*,_std::allocator<VCFace_*>_>::end
                       ((vector<VCFace_*,_std::allocator<VCFace_*>_> *)in_stack_fffffffffffff8e8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<VCFace_**,_std::vector<VCFace_*,_std::allocator<VCFace_*>_>_>
                        *)in_stack_fffffffffffff8f0.m_matrix,
                       (__normal_iterator<VCFace_**,_std::vector<VCFace_*,_std::allocator<VCFace_*>_>_>
                        *)in_stack_fffffffffffff8e8);
    if (!bVar2) break;
    ppVVar4 = __gnu_cxx::
              __normal_iterator<VCFace_**,_std::vector<VCFace_*,_std::allocator<VCFace_*>_>_>::
              operator*(&local_38);
    local_48 = *ppVVar4;
    collectRings(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    std::set<int,_std::less<int>,_std::allocator<int>_>::size
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x280a38);
    std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::allocator
              ((allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x280a55);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffff910,(size_type)in_stack_fffffffffffff908,
             (allocator_type *)in_stack_fffffffffffff900);
    std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~allocator
              ((allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x280a81);
    local_a8 = 0;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff910,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff908);
    local_c8 = local_78;
    local_d0._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff8e8);
    local_d8._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff8e8);
    while( true ) {
      bVar2 = std::operator!=(&local_d0,&local_d8);
      if (!bVar2) break;
      std::_Rb_tree_const_iterator<int>::operator*
                ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffff8f0.m_matrix);
      ::operator-((Vec3d *)in_stack_fffffffffffff928,(Vector3d *)in_stack_fffffffffffff920);
      sVar3 = (size_type)local_a8;
      local_a8 = local_a8 + 1;
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](&local_90,sVar3);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff8f0.m_matrix,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff8e8);
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffff8f0.m_matrix);
    }
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x280be4);
    make_coord_space(in_stack_fffffffffffffa10,(Vector3d *)in_stack_fffffffffffffa08);
    this_00 = Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                        (in_stack_fffffffffffff8e8);
    Eigen::Matrix<double,3,3,0,3,3>::Matrix<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff910,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
               in_stack_fffffffffffff908);
    local_a8 = 0;
    while( true ) {
      other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(long)local_a8;
      pMVar5 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               std::
               vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ::size(&local_90);
      if (pMVar5 <= other) break;
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](&local_90,(long)local_a8);
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                (in_stack_fffffffffffff908,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff900);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](&local_90,(long)local_a8);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff8f0.m_matrix,
                 (MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>
                  *)in_stack_fffffffffffff8e8);
      local_a8 = local_a8 + 1;
    }
    leastSquareFitting(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
    Eigen::Matrix<double,_2,_2,_0,_2,_2>::Matrix((Matrix<double,_2,_2,_0,_2,_2> *)0x280d11);
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)0x280d20);
    dVar8 = localCurvature(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                           in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    local_48->area = dVar8 * local_48->area;
    if ((*(byte *)(in_RDI + 0xc9) & 1) != 0) {
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                (in_stack_fffffffffffff8f8,(Index)in_stack_fffffffffffff8f0.m_matrix);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *)
                 in_stack_fffffffffffff910,(Index)in_stack_fffffffffffff908,
                 (Index)in_stack_fffffffffffff900);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::operator*
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 in_stack_fffffffffffff908,(Scalar *)in_stack_fffffffffffff900);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                (in_stack_fffffffffffff8f8,(Index)in_stack_fffffffffffff8f0.m_matrix);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *)
                 in_stack_fffffffffffff910,(Index)in_stack_fffffffffffff908,
                 (Index)in_stack_fffffffffffff900);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::operator*
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 in_stack_fffffffffffff908,(Scalar *)in_stack_fffffffffffff900);
      Eigen::
      MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>const>>
      ::operator+((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                   *)in_stack_fffffffffffff918,
                  (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                   *)in_stack_fffffffffffff910);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>_>
      ::normalized(in_stack_fffffffffffff9c8);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                (in_stack_fffffffffffff8f8,(Index)in_stack_fffffffffffff8f0.m_matrix);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *)
                 in_stack_fffffffffffff910,(Index)in_stack_fffffffffffff908,
                 (Index)in_stack_fffffffffffff900);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::operator*
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 in_stack_fffffffffffff908,(Scalar *)in_stack_fffffffffffff900);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                (in_stack_fffffffffffff8f8,(Index)in_stack_fffffffffffff8f0.m_matrix);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *)
                 in_stack_fffffffffffff910,(Index)in_stack_fffffffffffff908,
                 (Index)in_stack_fffffffffffff900);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::operator*
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 in_stack_fffffffffffff908,(Scalar *)in_stack_fffffffffffff900);
      Eigen::
      MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>const>>
      ::operator+((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                   *)in_stack_fffffffffffff918,
                  (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                   *)in_stack_fffffffffffff910);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>_>
      ::normalized(in_stack_fffffffffffff9c8);
      Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x280f6e);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                (in_stack_fffffffffffff8f8,(Index)in_stack_fffffffffffff8f0.m_matrix);
      Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                 in_stack_fffffffffffff8f0.m_matrix,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff8e8);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                (in_stack_fffffffffffff8f8,(Index)in_stack_fffffffffffff8f0.m_matrix);
      Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                 in_stack_fffffffffffff8f0.m_matrix,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff8e8);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_00.m_matrix,other);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                (in_stack_fffffffffffff8f8,(Index)in_stack_fffffffffffff8f0.m_matrix);
      Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
                ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)
                 in_stack_fffffffffffff8f0.m_matrix,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff8e8);
      Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x281034);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                          in_stack_fffffffffffff900,(Index)in_stack_fffffffffffff8f8);
      local_550 = ABS(*pSVar6);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator<<
                (in_stack_fffffffffffff8f8,(Scalar *)in_stack_fffffffffffff8f0.m_matrix);
      local_558 = 0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                (in_stack_fffffffffffff920,(Scalar *)in_stack_fffffffffffff918);
      local_560 = 0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                (in_stack_fffffffffffff920,(Scalar *)in_stack_fffffffffffff918);
      local_568 = 0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                (in_stack_fffffffffffff920,(Scalar *)in_stack_fffffffffffff918);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                          in_stack_fffffffffffff900,(Index)in_stack_fffffffffffff8f8);
      local_590[4] = ABS(*pSVar6);
      in_stack_fffffffffffff928 =
           Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (in_stack_fffffffffffff920,(Scalar *)in_stack_fffffffffffff918);
      local_590[3] = 0.0;
      in_stack_fffffffffffff920 =
           Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (in_stack_fffffffffffff920,(Scalar *)in_stack_fffffffffffff918);
      local_590[2] = 0.0;
      in_stack_fffffffffffff918 =
           Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (in_stack_fffffffffffff920,(Scalar *)in_stack_fffffffffffff918);
      local_590[1] = 0.0;
      in_stack_fffffffffffff910 =
           Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (in_stack_fffffffffffff920,(Scalar *)in_stack_fffffffffffff918);
      in_stack_fffffffffffff908 =
           (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                      in_stack_fffffffffffff900,(Index)in_stack_fffffffffffff8f8);
      local_590[0] = ABS(*(Scalar *)in_stack_fffffffffffff908);
      in_stack_fffffffffffff900 =
           (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                      in_stack_fffffffffffff900,(Index)in_stack_fffffffffffff8f8);
      local_598 = ABS(*(Scalar *)in_stack_fffffffffffff900);
      in_stack_fffffffffffff8f8 =
           (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
           std::max<double>(local_590,&local_598);
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                (in_stack_fffffffffffff920,(Scalar *)in_stack_fffffffffffff918);
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer
                ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x28125f);
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                (in_stack_fffffffffffff908,in_stack_fffffffffffff900);
      in_stack_fffffffffffff8f0 =
           Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                     (in_stack_fffffffffffff8e8);
      Eigen::
      MatrixBase<Eigen::CoeffBasedProduct<Eigen::Matrix<double,3,3,0,3,3>const&,Eigen::Matrix<double,3,3,0,3,3>const&,6>>
      ::operator*((MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_6>_>
                   *)in_stack_fffffffffffff908,
                  (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                  in_stack_fffffffffffff900);
      Eigen::Matrix<double,3,3,0,3,3>::operator=
                (in_stack_fffffffffffff8f0.m_matrix,
                 (MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_6>_>
                  *)in_stack_fffffffffffff8e8);
    }
    local_1c = local_1c + 1;
    if (local_20 < local_1c) {
      printf("%%%d...\n",(ulong)(uint)(local_24 * 10));
      sVar3 = std::vector<VCFace_*,_std::allocator<VCFace_*>_>::size(local_10);
      auVar9._8_4_ = (int)(sVar3 >> 0x20);
      auVar9._0_8_ = sVar3;
      auVar9._12_4_ = 0x45300000;
      local_24 = local_24 + 1;
      local_20 = (int)((((auVar9._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) / 10.0) *
                      (double)local_24);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff900);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)in_stack_fffffffffffff900);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2813e1);
    __gnu_cxx::__normal_iterator<VCFace_**,_std::vector<VCFace_*,_std::allocator<VCFace_*>_>_>::
    operator++(&local_38);
  }
  cVar7 = clock();
  printf("Done, uses %lf s for curvature.\n",(double)(cVar7 - local_18) / 1000000.0);
  return;
}

Assistant:

void VertexClustering::calcCurvature(vector<VCFace*> & faces)
{
	printf("start to calculate curvature for %lu faces...\n", faces.size());
	clock_t start = clock();
	int cnt = 0, n10 = faces.size() / 10, percent = 1;
	for (VCFace* f : faces) {
		set<int> rings(collectRings(f));
		vector<Vector3d> pts(rings.size());
		int i = 0;
		Vector3d origin = f->center;
		for (int id : rings)
			pts[i++] = vGroup->group[id].pos - origin;
		Matrix3d o2w;
		make_coord_space(o2w, f->normal);
		Matrix3d w2o = o2w.transpose();
		for (i = 0; i < pts.size(); i++) {
			pts[i] = w2o * pts[i]; //now pts are in object coordinate
		}
		vector<double> poly(leastSquareFitting(pts));
		Matrix2d eVecs;
		Vector2d eValues;
		double weight = localCurvature(poly, eValues, eVecs);
		f->area *= weight;       //update density based on curvature
		if (opts.anisotropic) {  
			//D1, D2 are the priciple directions in xyz coordinate, their eigenvalues are principle curvatures
			Vector3d D1 = (o2w.col(0) * eVecs(0, 0) + o2w.col(1) * eVecs(1, 0)).normalized();
			Vector3d D2 = (o2w.col(0) * eVecs(0, 1) + o2w.col(1) * eVecs(1, 1)).normalized();
			Matrix3d Rotation;
			Rotation.col(0) = D1;
			Rotation.col(1) = D2;
			Rotation.col(2) = D1.cross(D2);
			Matrix3d Stretch;
			Stretch << fabs(eValues(0)), 0, 0,
				0, fabs(eValues(1)), 0,
				0, 0, max(fabs(eValues(0)), fabs(eValues(1)));
			f->K = Rotation * Stretch * Rotation.transpose(); //compute the Riemannian metric
		}
		if (++cnt > n10) {
			printf("%%%d...\n", 10 * percent);
			n10 = faces.size() / 10.0 * ++percent;
		}
	}
	printf("Done, uses %lf s for curvature.\n", (double)(clock() - start) / CLOCKS_PER_SEC);
}